

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

JavascriptString * Js::JavascriptArray::ToLocaleStringHelper(Var value,ScriptContext *scriptContext)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  RecyclableObject *this;
  JavascriptString *pJVar6;
  char *message;
  char *error;
  uint lineNumber;
  char *fileName;
  
  if (value == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00b832f4;
    *puVar5 = 0;
LAB_00b831fd:
    this = UnsafeVarTo<Js::RecyclableObject>(value);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00b832f4;
      *puVar5 = 0;
    }
    TVar1 = ((this->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if ((int)TVar1 < 2) {
        pJVar6 = JavascriptLibrary::GetEmptyString
                           ((scriptContext->super_ScriptContextBase).javascriptLibrary);
        return pJVar6;
      }
      goto LAB_00b832e1;
    }
    BVar4 = RecyclableObject::IsExternal(this);
    if (BVar4 != 0) goto LAB_00b832e1;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
    ;
    error = "(typeId < TypeIds_Limit || obj->IsExternal())";
    message = "GetTypeId aValue has invalid TypeId";
    lineNumber = 0xe;
  }
  else {
    if (((ulong)value & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)value & 0xffff000000000000) != 0x1000000000000) {
      if ((ulong)value >> 0x32 != 0 || ((ulong)value & 0xffff000000000000) == 0x1000000000000)
      goto LAB_00b832e1;
      goto LAB_00b831fd;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
    ;
    error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    lineNumber = 0x2a;
  }
  bVar3 = Throw::ReportAssert(fileName,lineNumber,error,message);
  if (!bVar3) {
LAB_00b832f4:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar5 = 0;
LAB_00b832e1:
  pJVar6 = JavascriptConversion::ToLocaleString(value,scriptContext);
  return pJVar6;
}

Assistant:

JavascriptString* JavascriptArray::ToLocaleStringHelper(Var value, ScriptContext* scriptContext)
    {
        TypeId typeId = JavascriptOperators::GetTypeId(value);
        if (typeId <= TypeIds_UndefinedOrNull)
        {
            return scriptContext->GetLibrary()->GetEmptyString();
        }
        else
        {
            return JavascriptConversion::ToLocaleString(value, scriptContext);
        }
    }